

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

string * __thiscall
cmFileAPI::NoSupportedVersion_abi_cxx11_
          (string *__return_storage_ptr__,cmFileAPI *this,
          vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *versions)

{
  bool bVar1;
  reference pRVar2;
  ostream *poVar3;
  RequestVersion *v;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *__range2;
  undefined1 local_190 [8];
  ostringstream msg;
  vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *versions_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::operator<<((ostream *)local_190,"no supported version specified");
  bVar1 = std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>::empty
                    ((vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                      *)this);
  if (!bVar1) {
    std::operator<<((ostream *)local_190," among:");
    __end2 = std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>::
             begin((vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *)
                   this);
    v = (RequestVersion *)
        std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>::end
                  ((vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *)
                   this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmFileAPI::RequestVersion_*,_std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>_>
                                       *)&v), bVar1) {
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_cmFileAPI::RequestVersion_*,_std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>_>
               ::operator*(&__end2);
      poVar3 = std::operator<<((ostream *)local_190," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pRVar2->Major);
      poVar3 = std::operator<<(poVar3,".");
      std::ostream::operator<<(poVar3,pRVar2->Minor);
      __gnu_cxx::
      __normal_iterator<const_cmFileAPI::RequestVersion_*,_std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>_>
      ::operator++(&__end2);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::NoSupportedVersion(
  std::vector<RequestVersion> const& versions)
{
  std::ostringstream msg;
  msg << "no supported version specified";
  if (!versions.empty()) {
    msg << " among:";
    for (RequestVersion const& v : versions) {
      msg << " " << v.Major << "." << v.Minor;
    }
  }
  return msg.str();
}